

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

bool __thiscall
OpenGliderConnection::AcListLookup
          (OpenGliderConnection *this,string *sDevId,FDKeyTy *key,FDStaticData *stat)

{
  byte bVar1;
  bool bVar2;
  logLevelTy lVar3;
  ulong uVar4;
  undefined8 uVar5;
  string *psVar6;
  mapped_type *pmVar7;
  char *in_RCX;
  string *in_RSI;
  key_type *in_RDI;
  OGNAnonymousIdMapTy *anon;
  string idKey;
  OGN_DDB_RecTy rec;
  char sErr [100];
  string sFileName;
  unsigned_long uDevId;
  size_t *in_stack_fffffffffffffe28;
  char *t;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy>_>_>
  *in_stack_fffffffffffffe70;
  string local_170 [24];
  unsigned_long in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  FDKeyType _eType;
  FDKeyTy *in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  unsigned_long *in_stack_fffffffffffffec8;
  unsigned_long *in_stack_fffffffffffffed0;
  unsigned_long in_stack_fffffffffffffed8;
  size_t *in_stack_fffffffffffffee0;
  ifstream *in_stack_fffffffffffffee8;
  size_t in_stack_ffffffffffffff00;
  undefined1 local_f8 [8];
  char local_f0;
  char local_ef [15];
  char local_d5;
  char in_stack_ffffffffffffff34;
  undefined1 local_c8 [4];
  string local_50 [32];
  unsigned_long local_30;
  char *local_28;
  string *local_18;
  bool local_1;
  
  _eType = (FDKeyType)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_30 = std::__cxx11::stoul((string *)
                                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                 in_stack_fffffffffffffe28,0);
  uVar4 = std::ifstream::is_open();
  if ((uVar4 & 1) == 0) {
    DataRefs::GetLTPluginPath_abi_cxx11_(&dataRefs);
    std::operator+(in_stack_fffffffffffffe58,
                   (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    in_stack_fffffffffffffe58 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (in_RDI[0x17].field_2._M_local_buf + 8);
    std::operator|(_S_bin,_S_in);
    std::ifstream::open((string *)in_stack_fffffffffffffe58,(_Ios_Openmode)local_50);
    bVar1 = std::ios::operator!((ios *)((long)&in_RDI[0x17].field_2 +
                                       *(long *)(*(long *)((long)&in_RDI[0x17].field_2 + 8) + -0x18)
                                       + 8));
    if ((bVar1 & 1) != 0) {
      __errno_location();
      strerror_s((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (size_t)in_stack_fffffffffffffe28,0);
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 4) {
        uVar5 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
               ,0x3c6,"AcListLookup",logERR,"Could not open \'%s\' for reading: %s",uVar5,local_c8);
      }
    }
    std::__cxx11::string::~string(local_50);
  }
  OGN_DDB_RecTy::OGN_DDB_RecTy((OGN_DDB_RecTy *)local_f8);
  uVar4 = std::ifstream::is_open();
  if ((uVar4 & 1) != 0) {
    t = (char *)0x30;
    bVar2 = FileRecLookup(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                          in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          in_stack_ffffffffffffff00);
    if (bVar2) {
      if (local_ef[0] != ' ') {
        std::__cxx11::string::assign(local_28 + 0x80,(ulong)local_ef);
        rtrim((string *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),t);
      }
      if (local_d5 != ' ') {
        std::__cxx11::string::assign(local_28,(ulong)&local_d5);
        rtrim((string *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),t);
      }
      if (in_stack_ffffffffffffff34 != ' ') {
        std::__cxx11::string::assign(local_28 + 0xd8,(ulong)&stack0xffffffffffffff34);
        rtrim((string *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),t);
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        psVar6 = ModelIcaoType::getIcaoType(in_stack_fffffffffffffe58);
        std::__cxx11::string::operator=((string *)(local_28 + 0x40),(string *)psVar6);
      }
      goto LAB_0020c334;
    }
  }
  memset(&stack0xfffffffffffffed8,0,0x30);
  OGN_DDB_RecTy::OGN_DDB_RecTy((OGN_DDB_RecTy *)&stack0xfffffffffffffed8);
  memcpy(local_f8,&stack0xfffffffffffffed8,0x30);
  local_f0 = 'O';
  OGN_DDB_RecTy::SetTracked((OGN_DDB_RecTy *)local_f8);
LAB_0020c334:
  bVar2 = OGN_DDB_RecTy::IsTracked((OGN_DDB_RecTy *)local_f8);
  if (bVar2) {
    bVar2 = OGN_DDB_RecTy::IsIdentified((OGN_DDB_RecTy *)local_f8);
    if (bVar2) {
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_
                (in_stack_fffffffffffffeb8,_eType,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
    }
    else {
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffeb8,local_18);
      std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffeb8,'_');
      std::__cxx11::string::operator+=((string *)&stack0xfffffffffffffeb8,local_f0);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OGNAnonymousIdMapTy>_>_>
               ::operator[](in_stack_fffffffffffffe70,in_RDI);
      LTFlightData::FDKeyTy::SetKey_abi_cxx11_
                (in_stack_fffffffffffffeb8,(FDKeyType)((ulong)pmVar7 >> 0x20),
                 in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::operator=((string *)(local_28 + 0xd8),(string *)&pmVar7->anonymCall);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OpenGliderConnection::AcListLookup (const std::string& sDevId,
                                         LTFlightData::FDKeyTy& key,
                                         LTFlightData::FDStaticData& stat)
{
    // device id converted to binary number
    unsigned long uDevId = std::stoul(sDevId, nullptr, 16);
    
    // If needed open the file
    if (!ifAcList.is_open()) {
        // open the input file in binary mode
        const std::string sFileName = dataRefs.GetLTPluginPath() + OGN_AC_LIST_FILE;
        ifAcList.open (sFileName, std::ios::binary | std::ios::in);
        if (!ifAcList) {
            char sErr[SERR_LEN];
            strerror_s(sErr, sizeof(sErr), errno);
            LOG_MSG(logERR, ERR_OGN_ACL_FILE_OPEN_R, sFileName.c_str(), sErr);
        }
    }
    
    // look up data in the sorted file
    OGN_DDB_RecTy rec;
    if (ifAcList.is_open() &&
        FileRecLookup (ifAcList, numRecAcList,
                       uDevId, minKeyAcList, maxKeyAcList,
                       &rec, sizeof(rec)))
    {
        // copy some information into the stat structure
        if (*rec.mdl != ' ') { stat.mdl.assign(rec.mdl,sizeof(rec.mdl)); rtrim(stat.mdl); }
        if (*rec.reg != ' ') { stat.reg.assign(rec.reg,sizeof(rec.reg)); rtrim(stat.reg); }
        if (*rec.cn  != ' ') { stat.call.assign(rec.cn,sizeof(rec.cn));  rtrim(stat.call); }
        
        // based on the model information look up an ICAO a/c type
        if (!stat.mdl.empty())
            stat.acTypeIcao = ModelIcaoType::getIcaoType(stat.mdl);
    } else {
        // clear the record again (potentially used as buffer during lookup)
        // This will also CLEAR the TRACKED and IDENTIFIED flags
        // as required for a device not found in the DDB:
        rec = OGN_DDB_RecTy();
        rec.devType = 'O';          // treat it as an OGN id from the outset
        rec.SetTracked();           // tracking a not-in-DDB device is OK
    }
    
    // If the device doesn't want to be tracked we bail
    if (!rec.IsTracked())
        return false;
    
    // *** Aircraft key type / device
    
    // If the device doesn't want to be identified -> map to generated anonymous id
    if (!rec.IsIdentified()) {
        // clear any potentially identifying information
        stat.reg.clear();
        stat.call.clear();

        // The key into the map consists of the device id and the device type
        std::string idKey (sDevId);             // device id string
        idKey += '_';                           // _
        idKey += rec.devType;                   // append device type (F or I or even O) to increase uniqueness - just in case...
        // look up or _create_ the mapping record to the generated anonymous id
        OGNAnonymousIdMapTy& anon = mapAnonymousId[idKey];
        // take over the mapped anonymous id
        key.SetKey(LTFlightData::KEY_OGN, anon.anonymId);
        stat.call = anon.anonymCall;
    } else {
        // device is allowed to be identified
        key.SetKey(rec.devType == 'F' ? LTFlightData::KEY_FLARM    :
                   rec.devType == 'I' ? LTFlightData::KEY_ICAO     : LTFlightData::KEY_OGN,
                   uDevId);
    }
    
    // is allowed to be tracked, ie. is visible
    return true;
}